

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

Segment * reflection(Segment *__return_storage_ptr__,Segment *segment,Sphere *sphere)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  uVar2 = (segment->b).x;
  uVar5 = (segment->b).y;
  fVar12 = sphere->radius;
  fVar13 = ((float)uVar2 - (sphere->center).x) / fVar12;
  fVar11 = ((float)uVar5 - (sphere->center).y) / fVar12;
  fVar12 = ((segment->b).z - (sphere->center).z) / fVar12;
  fVar8 = fVar12 * fVar12 + fVar13 * fVar13 + fVar11 * fVar11;
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  uVar3 = (segment->b).x;
  uVar6 = (segment->b).y;
  fVar16 = (float)uVar3 - (segment->a).x;
  fVar15 = (float)uVar6 - (segment->a).y;
  fVar14 = (segment->b).z - (segment->a).z;
  fVar9 = fVar14 * fVar14 + fVar16 * fVar16 + fVar15 * fVar15;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  fVar10 = (fVar14 / fVar9) * (fVar12 / fVar8) +
           (fVar16 / fVar9) * (fVar13 / fVar8) + (fVar11 / fVar8) * (fVar15 / fVar9);
  fVar10 = fVar10 + fVar10;
  (__return_storage_ptr__->a).z = (segment->b).z;
  fVar1 = (segment->b).y;
  (__return_storage_ptr__->a).x = (segment->b).x;
  (__return_storage_ptr__->a).y = fVar1;
  uVar4 = (segment->b).x;
  uVar7 = (segment->b).y;
  fVar1 = (segment->b).z;
  (__return_storage_ptr__->b).x = (fVar16 / fVar9 - (fVar13 / fVar8) * fVar10) + (float)uVar4;
  (__return_storage_ptr__->b).y = (float)uVar7 + (fVar15 / fVar9 - (fVar11 / fVar8) * fVar10);
  (__return_storage_ptr__->b).z = (fVar14 / fVar9 - fVar10 * (fVar12 / fVar8)) + fVar1;
  return __return_storage_ptr__;
}

Assistant:

Segment reflection(Segment const& segment, Sphere const& sphere)
{
  Point normalVector = normalize((segment.b - sphere.center) / sphere.radius);

  Vector ri = normalize(segment.b - segment.a);
  float dot = dotProduct(ri, normalVector);
  ri -= normalVector * (2 * dot);

  return {segment.b, segment.b + ri};
}